

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall bloaty::Bloaty::ScanAndRollup(Bloaty *this,Options *options,RollupOutput *output)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  size_t sVar5;
  _Rb_tree_node_base *p_Var6;
  Rollup *pRVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer pbVar8;
  iterator __begin2;
  pointer pIVar9;
  pointer pIVar10;
  Arg *in_R9;
  InputFileInfo *file_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *build_id;
  pointer pbVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar12;
  string_view name_00;
  string_view from;
  string_view format;
  string_view from_00;
  string_view format_00;
  string_view from_01;
  string_view format_01;
  string_view format_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  build_ids;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input_filenames;
  Rollup base;
  string input_files;
  string unused_debug;
  Rollup rollup;
  string local_1f8;
  undefined1 local_1d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Options *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string local_158;
  Rollup local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined8 local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [24];
  int64_t iStack_90;
  ReImpl *local_88;
  __buckets_ptr pp_Stack_80;
  size_type local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  
  pIVar10 = (this->input_files_).
            super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar9 = (this->input_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1a0 = options;
  if (pIVar10 == pIVar9) {
    Throw("no filename specified",0x766);
  }
  pbVar8 = (this->source_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (this->source_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar11) {
    do {
      name_00._M_str = (pbVar8->_M_dataplus)._M_p;
      name_00._M_len = pbVar8->_M_string_length;
      RollupOutput::AddDataSourceName(output,name_00);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar11);
    pIVar10 = (this->input_files_).
              super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar9 = (this->input_files_).
             super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_70._M_buckets = &local_70._M_single_bucket;
  local_88 = (ReImpl *)0x0;
  pp_Stack_80 = (__buckets_ptr)0x0;
  local_a8._16_8_ = 0;
  iStack_90 = 0;
  local_78 = 0;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pIVar10 != pIVar9) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_178,&pIVar10->filename_);
      pIVar10 = pIVar10 + 1;
    } while (pIVar10 != pIVar9);
  }
  ScanAndRollupFiles(this,&local_178,&local_198,(Rollup *)(local_a8 + 0x10));
  pIVar10 = (this->base_files_).
            super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar9 = (this->base_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar10 == pIVar9) {
    (output->toplevel_row_).size.vm = local_a8._16_8_;
    (output->toplevel_row_).size.file = iStack_90;
    (output->toplevel_row_).filtered_size.vm = (int64_t)local_88;
    (output->toplevel_row_).filtered_size.file = (int64_t)pp_Stack_80;
    (output->toplevel_row_).vmpercent = 100.0;
    (output->toplevel_row_).filepercent = 100.0;
    output->diff_mode_ = true;
    Rollup::CreateRows((Rollup *)(local_a8 + 0x10),&output->toplevel_row_,(Rollup *)0x0,local_1a0,
                       true);
    output->diff_mode_ = false;
  }
  else {
    local_138.children_._M_h._M_buckets = &local_138.children_._M_h._M_single_bucket;
    local_138.filtered_vm_total_ = 0;
    local_138.filtered_file_total_ = 0;
    local_138.vm_total_ = 0;
    local_138.file_total_ = 0;
    local_138.filter_regex_ = (ReImpl *)0x0;
    local_138.children_._M_h._M_bucket_count = 1;
    local_138.children_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_138.children_._M_h._M_element_count = 0;
    local_138.children_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_138.children_._M_h._M_rehash_policy._M_next_resize = 0;
    local_138.children_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_1c8._M_dataplus._M_p = (pointer)0x0;
    local_1d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d8,&pIVar10->filename_);
      pIVar10 = pIVar10 + 1;
    } while (pIVar10 != pIVar9);
    ScanAndRollupFiles(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1d8,&local_198,&local_138);
    Rollup::AddEntriesFrom((Rollup *)(local_a8 + 0x10),&local_138);
    Rollup::CreateDiffModeRollupOutput((Rollup *)(local_a8 + 0x10),&local_138,local_1a0,output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_138.children_._M_h);
  }
  pbVar8 = local_198.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar11 = local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&(this->debug_files_)._M_t,pbVar11);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&(this->debug_files_)._M_t,(_Base_ptr)pVar12.first._M_node,
                     (_Base_ptr)pVar12.second._M_node);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar8);
  }
  if ((this->debug_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_70);
    return;
  }
  local_d8 = &local_c8;
  local_d0 = 0;
  local_c8._M_dataplus._M_p._0_1_ = 0;
  pRVar7 = (Rollup *)local_a8;
  local_c8.field_2._8_8_ = 0;
  local_a8[0] = 0;
  local_c8.field_2._M_allocated_capacity = (size_type)pRVar7;
  for (p_Var6 = (this->debug_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->debug_files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    from_00._M_str = (char *)pRVar7;
    from_00._M_len = *(size_t *)(p_Var6 + 1);
    absl::BytesToHexString_abi_cxx11_(&local_1f8,(absl *)p_Var6[1]._M_parent,from_00);
    _Var2._M_p = local_1f8._M_dataplus._M_p;
    if (local_1f8._M_dataplus._M_p == (char *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = strlen(local_1f8._M_dataplus._M_p);
    }
    pcVar1 = *(char **)(p_Var6 + 2);
    if (pcVar1 == (char *)0x0) {
      local_138.filtered_vm_total_ = 0;
    }
    else {
      local_138.filtered_vm_total_ = strlen(pcVar1);
    }
    local_1d8._0_8_ = &local_1c8;
    local_1d8._8_8_ = (pointer)0x0;
    local_1c8._M_dataplus._M_p = local_1c8._M_dataplus._M_p & 0xffffffffffffff00;
    local_138.file_total_ = (int64_t)_Var2._M_p;
    pRVar7 = &local_138;
    format_00._M_str = (char *)pRVar7;
    format_00._M_len = (size_t)"$0   $1\n";
    local_138.vm_total_ = sVar5;
    local_138.filtered_file_total_ = (int64_t)pcVar1;
    absl::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)local_1d8,(Nonnull<std::string_*>)0x8,format_00,
               (Nullable<const_absl::string_view_*>)0x2,(size_t)in_R9);
    std::__cxx11::string::_M_append(local_c8.field_2._M_local_buf,local_1d8._0_8_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
        &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8._M_dataplus._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar9 = (this->input_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar10 = (this->input_files_).
                 super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pIVar10 != pIVar9; pIVar10 = pIVar10 + 1
      ) {
    from._M_str = (char *)pRVar7;
    from._M_len = (size_t)(pIVar10->build_id_)._M_dataplus._M_p;
    absl::BytesToHexString_abi_cxx11_(&local_1f8,(absl *)(pIVar10->build_id_)._M_string_length,from)
    ;
    _Var2._M_p = local_1f8._M_dataplus._M_p;
    if (local_1f8._M_dataplus._M_p == (char *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = strlen(local_1f8._M_dataplus._M_p);
    }
    pcVar1 = (pIVar10->filename_)._M_dataplus._M_p;
    if (pcVar1 == (char *)0x0) {
      local_138.filtered_vm_total_ = 0;
    }
    else {
      local_138.filtered_vm_total_ = strlen(pcVar1);
    }
    local_1d8._0_8_ = &local_1c8;
    local_1d8._8_8_ = (pointer)0x0;
    local_1c8._M_dataplus._M_p = local_1c8._M_dataplus._M_p & 0xffffffffffffff00;
    local_138.file_total_ = (int64_t)_Var2._M_p;
    pRVar7 = &local_138;
    format._M_str = (char *)pRVar7;
    format._M_len = (size_t)"$0   $1\n";
    local_138.vm_total_ = sVar5;
    local_138.filtered_file_total_ = (int64_t)pcVar1;
    absl::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)local_1d8,(Nonnull<std::string_*>)0x8,format,
               (Nullable<const_absl::string_view_*>)0x2,(size_t)in_R9);
    std::__cxx11::string::_M_append((char *)&local_d8,local_1d8._0_8_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
        &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8._M_dataplus._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar10 = (this->base_files_).
            super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar9 = (this->base_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar10 != pIVar9) {
    do {
      from_01._M_str = (char *)pRVar7;
      from_01._M_len = (size_t)(pIVar10->build_id_)._M_dataplus._M_p;
      absl::BytesToHexString_abi_cxx11_
                (&local_158,(absl *)(pIVar10->build_id_)._M_string_length,from_01);
      _Var2._M_p = local_158._M_dataplus._M_p;
      if (local_158._M_dataplus._M_p == (char *)0x0) {
        local_138.vm_total_ = 0;
      }
      else {
        local_138.vm_total_ = strlen(local_158._M_dataplus._M_p);
      }
      local_138.file_total_ = (int64_t)_Var2._M_p;
      pbVar8 = (pointer)(pIVar10->filename_)._M_dataplus._M_p;
      if (pbVar8 == (pointer)0x0) {
        local_1d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        local_1d8._0_8_ = strlen((char *)pbVar8);
      }
      format_01._M_str = (char *)&local_138;
      format_01._M_len = (size_t)"$0   $1\n";
      pRVar7 = &local_138;
      local_1d8._8_8_ = pbVar8;
      absl::Substitute_abi_cxx11_(&local_1f8,(absl *)0x8,format_01,(Arg *)local_1d8,in_R9);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_1f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      pIVar10 = pIVar10 + 1;
    } while (pIVar10 != pIVar9);
  }
  uVar4 = local_c8.field_2._M_allocated_capacity;
  if ((Rollup *)local_c8.field_2._M_allocated_capacity == (Rollup *)0x0) {
    local_138.vm_total_ = 0;
  }
  else {
    local_138.vm_total_ = strlen((char *)local_c8.field_2._M_allocated_capacity);
  }
  pbVar3 = local_d8;
  local_138.file_total_ = uVar4;
  if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_1d8._0_8_ = (pointer)0x0;
  }
  else {
    local_1d8._0_8_ = strlen((char *)local_d8);
  }
  local_1d8._8_8_ = pbVar3;
  format_02._M_str = (char *)&local_138;
  format_02._M_len = (size_t)"Debug file(s) did not match any input file:\n$0\nInput Files:\n$1";
  absl::Substitute_abi_cxx11_(&local_1f8,(absl *)0x3e,format_02,(Arg *)local_1d8,in_R9);
  Throw(local_1f8._M_dataplus._M_p,0x79b);
}

Assistant:

void Bloaty::ScanAndRollup(const Options& options, RollupOutput* output) {
  if (input_files_.empty()) {
    THROW("no filename specified");
  }

  for (const auto& name : source_names_) {
    output->AddDataSourceName(name);
  }

  Rollup rollup;
  std::vector<std::string> build_ids;
  std::vector<std::string> input_filenames;
  for (const auto& file_info : input_files_) {
    input_filenames.push_back(file_info.filename_);
  }
  ScanAndRollupFiles(input_filenames, &build_ids, &rollup);

  if (!base_files_.empty()) {
    Rollup base;
    std::vector<std::string> base_filenames;
    for (const auto& file_info : base_files_) {
      base_filenames.push_back(file_info.filename_);
    }
    ScanAndRollupFiles(base_filenames, &build_ids, &base);
    rollup.AddEntriesFrom(base);
    rollup.CreateDiffModeRollupOutput(&base, options, output);
  } else {
    rollup.CreateRollupOutput(options, output);
  }

  for (const auto& build_id : build_ids) {
    debug_files_.erase(build_id);
  }

  // Error out if some --debug-files were not used.
  if (!debug_files_.empty()) {
    std::string input_files;
    std::string unused_debug;
    for (const auto& pair : debug_files_) {
      unused_debug += absl::Substitute(
          "$0   $1\n", absl::BytesToHexString(pair.first).c_str(),
          pair.second.c_str());
    }

    for (const auto& file_info : input_files_) {
      input_files += absl::Substitute(
          "$0   $1\n", absl::BytesToHexString(file_info.build_id_).c_str(),
          file_info.filename_.c_str());
    }
    for (const auto& file_info : base_files_) {
      input_files += absl::Substitute(
          "$0   $1\n", absl::BytesToHexString(file_info.build_id_).c_str(),
          file_info.filename_.c_str());
    }
    THROWF("Debug file(s) did not match any input file:\n$0\nInput Files:\n$1",
           unused_debug.c_str(), input_files.c_str());
  }
}